

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

bool __thiscall
Js::DynamicProfileInfo::Serialize<Js::BufferWriter>(DynamicProfileInfo *this,BufferWriter *writer)

{
  FunctionBody *pFVar1;
  bool bVar2;
  ProfileId PVar3;
  uint uVar4;
  BVIndex BVar5;
  BVFixed **ppBVar6;
  BVFixed *pBVar7;
  BVUnit *data;
  byte local_1d9;
  byte local_f9;
  WriteBarrierPtr<Js::ImplicitCallFlags> local_f8;
  uint local_ec;
  WriteBarrierPtr<ValueType> local_e8;
  ProfileId local_da;
  WriteBarrierPtr<ValueType> local_d8;
  ProfileId local_ca;
  WriteBarrierPtr<ValueType> local_c8;
  ProfileId local_ba;
  WriteBarrierPtr<Js::CallSiteInfo> local_b8;
  ProfileId local_aa;
  WriteBarrierPtr<Js::CallSiteInfo> local_a8;
  ProfileId local_9a;
  WriteBarrierPtr<ValueType> local_98;
  ProfileId local_8a;
  WriteBarrierPtr<Js::FldInfo> local_88;
  uint local_7c;
  WriteBarrierPtr<Js::ArrayCallSiteInfo> local_78;
  ProfileId local_6a;
  WriteBarrierPtr<Js::StElemInfo> local_68;
  ProfileId local_5a;
  WriteBarrierPtr<Js::LdElemInfo> local_58;
  ProfileId local_4a;
  WriteBarrierPtr<Js::LdLenInfo> local_48;
  ProfileId local_3a;
  WriteBarrierPtr<ValueType> local_38;
  LocalFunctionId local_30;
  ArgSlot local_2a;
  FunctionBody *pFStack_28;
  ArgSlot paramInfoCount;
  FunctionBody *functionBody;
  BufferWriter *writer_local;
  DynamicProfileInfo *this_local;
  
  functionBody = (FunctionBody *)writer;
  writer_local = (BufferWriter *)this;
  BufferWriter::Log(writer,this);
  pFStack_28 = GetFunctionBody(this);
  local_2a = FunctionBody::GetProfiledInParamsCount(pFStack_28);
  pFVar1 = functionBody;
  local_30 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFStack_28);
  bVar2 = BufferWriter::Write<unsigned_int>((BufferWriter *)pFVar1,&local_30);
  local_f9 = 1;
  if (bVar2) {
    bVar2 = BufferWriter::Write<unsigned_short>((BufferWriter *)functionBody,&local_2a);
    pFVar1 = functionBody;
    local_f9 = 1;
    if (bVar2) {
      Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr(&local_38,&this->parameterInfo);
      bVar2 = BufferWriter::WriteArray<ValueType>((BufferWriter *)pFVar1,&local_38,(ulong)local_2a);
      pFVar1 = functionBody;
      local_f9 = 1;
      if (bVar2) {
        local_3a = FunctionBody::GetProfiledLdLenCount(pFStack_28);
        bVar2 = BufferWriter::Write<unsigned_short>((BufferWriter *)pFVar1,&local_3a);
        pFVar1 = functionBody;
        local_f9 = 1;
        if (bVar2) {
          Memory::WriteBarrierPtr<Js::LdLenInfo>::WriteBarrierPtr(&local_48,&this->ldLenInfo);
          PVar3 = FunctionBody::GetProfiledLdLenCount(pFStack_28);
          bVar2 = BufferWriter::WriteArray<Js::LdLenInfo>
                            ((BufferWriter *)pFVar1,&local_48,(ulong)PVar3);
          pFVar1 = functionBody;
          local_f9 = 1;
          if (bVar2) {
            local_4a = FunctionBody::GetProfiledLdElemCount(pFStack_28);
            bVar2 = BufferWriter::Write<unsigned_short>((BufferWriter *)pFVar1,&local_4a);
            pFVar1 = functionBody;
            local_f9 = 1;
            if (bVar2) {
              Memory::WriteBarrierPtr<Js::LdElemInfo>::WriteBarrierPtr(&local_58,&this->ldElemInfo);
              PVar3 = FunctionBody::GetProfiledLdElemCount(pFStack_28);
              bVar2 = BufferWriter::WriteArray<Js::LdElemInfo>
                                ((BufferWriter *)pFVar1,&local_58,(ulong)PVar3);
              pFVar1 = functionBody;
              local_f9 = 1;
              if (bVar2) {
                local_5a = FunctionBody::GetProfiledStElemCount(pFStack_28);
                bVar2 = BufferWriter::Write<unsigned_short>((BufferWriter *)pFVar1,&local_5a);
                pFVar1 = functionBody;
                local_f9 = 1;
                if (bVar2) {
                  Memory::WriteBarrierPtr<Js::StElemInfo>::WriteBarrierPtr
                            (&local_68,&this->stElemInfo);
                  PVar3 = FunctionBody::GetProfiledStElemCount(pFStack_28);
                  bVar2 = BufferWriter::WriteArray<Js::StElemInfo>
                                    ((BufferWriter *)pFVar1,&local_68,(ulong)PVar3);
                  pFVar1 = functionBody;
                  local_f9 = 1;
                  if (bVar2) {
                    local_6a = FunctionBody::GetProfiledArrayCallSiteCount(pFStack_28);
                    bVar2 = BufferWriter::Write<unsigned_short>((BufferWriter *)pFVar1,&local_6a);
                    pFVar1 = functionBody;
                    local_f9 = 1;
                    if (bVar2) {
                      Memory::WriteBarrierPtr<Js::ArrayCallSiteInfo>::WriteBarrierPtr
                                (&local_78,&this->arrayCallSiteInfo);
                      PVar3 = FunctionBody::GetProfiledArrayCallSiteCount(pFStack_28);
                      bVar2 = BufferWriter::WriteArray<Js::ArrayCallSiteInfo>
                                        ((BufferWriter *)pFVar1,&local_78,(ulong)PVar3);
                      pFVar1 = functionBody;
                      local_f9 = 1;
                      if (bVar2) {
                        local_7c = FunctionBody::GetProfiledFldCount(pFStack_28);
                        bVar2 = BufferWriter::Write<unsigned_int>((BufferWriter *)pFVar1,&local_7c);
                        pFVar1 = functionBody;
                        local_f9 = 1;
                        if (bVar2) {
                          Memory::WriteBarrierPtr<Js::FldInfo>::WriteBarrierPtr
                                    (&local_88,&this->fldInfo);
                          uVar4 = FunctionBody::GetProfiledFldCount(pFStack_28);
                          bVar2 = BufferWriter::WriteArray<Js::FldInfo>
                                            ((BufferWriter *)pFVar1,&local_88,(ulong)uVar4);
                          pFVar1 = functionBody;
                          local_f9 = 1;
                          if (bVar2) {
                            local_8a = FunctionBody::GetProfiledSlotCount(pFStack_28);
                            bVar2 = BufferWriter::Write<unsigned_short>
                                              ((BufferWriter *)pFVar1,&local_8a);
                            pFVar1 = functionBody;
                            local_f9 = 1;
                            if (bVar2) {
                              Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr
                                        (&local_98,&this->slotInfo);
                              PVar3 = FunctionBody::GetProfiledSlotCount(pFStack_28);
                              bVar2 = BufferWriter::WriteArray<ValueType>
                                                ((BufferWriter *)pFVar1,&local_98,(ulong)PVar3);
                              pFVar1 = functionBody;
                              local_f9 = 1;
                              if (bVar2) {
                                local_9a = FunctionBody::GetProfiledCallSiteCount(pFStack_28);
                                bVar2 = BufferWriter::Write<unsigned_short>
                                                  ((BufferWriter *)pFVar1,&local_9a);
                                pFVar1 = functionBody;
                                local_f9 = 1;
                                if (bVar2) {
                                  Memory::WriteBarrierPtr<Js::CallSiteInfo>::WriteBarrierPtr
                                            (&local_a8,&this->callSiteInfo);
                                  PVar3 = FunctionBody::GetProfiledCallSiteCount(pFStack_28);
                                  bVar2 = BufferWriter::WriteArray<Js::CallSiteInfo>
                                                    ((BufferWriter *)pFVar1,&local_a8,(ulong)PVar3);
                                  pFVar1 = functionBody;
                                  local_f9 = 1;
                                  if (bVar2) {
                                    local_aa = FunctionBody::GetProfiledCallApplyCallSiteCount
                                                         (pFStack_28);
                                    bVar2 = BufferWriter::Write<unsigned_short>
                                                      ((BufferWriter *)pFVar1,&local_aa);
                                    pFVar1 = functionBody;
                                    local_f9 = 1;
                                    if (bVar2) {
                                      Memory::WriteBarrierPtr<Js::CallSiteInfo>::WriteBarrierPtr
                                                (&local_b8,&this->callApplyTargetInfo);
                                      PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount
                                                        (pFStack_28);
                                      bVar2 = BufferWriter::WriteArray<Js::CallSiteInfo>
                                                        ((BufferWriter *)pFVar1,&local_b8,
                                                         (ulong)PVar3);
                                      pFVar1 = functionBody;
                                      local_f9 = 1;
                                      if (bVar2) {
                                        local_ba = FunctionBody::GetProfiledDivOrRemCount
                                                             (pFStack_28);
                                        bVar2 = BufferWriter::Write<unsigned_short>
                                                          ((BufferWriter *)pFVar1,&local_ba);
                                        pFVar1 = functionBody;
                                        local_f9 = 1;
                                        if (bVar2) {
                                          Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr
                                                    (&local_c8,&this->divideTypeInfo);
                                          PVar3 = FunctionBody::GetProfiledDivOrRemCount(pFStack_28)
                                          ;
                                          bVar2 = BufferWriter::WriteArray<ValueType>
                                                            ((BufferWriter *)pFVar1,&local_c8,
                                                             (ulong)PVar3);
                                          pFVar1 = functionBody;
                                          local_f9 = 1;
                                          if (bVar2) {
                                            local_ca = FunctionBody::GetProfiledSwitchCount
                                                                 (pFStack_28);
                                            bVar2 = BufferWriter::Write<unsigned_short>
                                                              ((BufferWriter *)pFVar1,&local_ca);
                                            pFVar1 = functionBody;
                                            local_f9 = 1;
                                            if (bVar2) {
                                              Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr
                                                        (&local_d8,&this->switchTypeInfo);
                                              PVar3 = FunctionBody::GetProfiledSwitchCount
                                                                (pFStack_28);
                                              bVar2 = BufferWriter::WriteArray<ValueType>
                                                                ((BufferWriter *)pFVar1,&local_d8,
                                                                 (ulong)PVar3);
                                              pFVar1 = functionBody;
                                              local_f9 = 1;
                                              if (bVar2) {
                                                local_da = FunctionBody::GetProfiledReturnTypeCount
                                                                     (pFStack_28);
                                                bVar2 = BufferWriter::Write<unsigned_short>
                                                                  ((BufferWriter *)pFVar1,&local_da)
                                                ;
                                                pFVar1 = functionBody;
                                                local_f9 = 1;
                                                if (bVar2) {
                                                  Memory::WriteBarrierPtr<ValueType>::
                                                  WriteBarrierPtr(&local_e8,&this->returnTypeInfo);
                                                  PVar3 = FunctionBody::GetProfiledReturnTypeCount
                                                                    (pFStack_28);
                                                  bVar2 = BufferWriter::WriteArray<ValueType>
                                                                    ((BufferWriter *)pFVar1,
                                                                     &local_e8,(ulong)PVar3);
                                                  pFVar1 = functionBody;
                                                  local_f9 = 1;
                                                  if (bVar2) {
                                                    local_ec = FunctionBody::GetLoopCount
                                                                         (pFStack_28);
                                                    bVar2 = BufferWriter::Write<unsigned_int>
                                                                      ((BufferWriter *)pFVar1,
                                                                       &local_ec);
                                                    pFVar1 = functionBody;
                                                    local_f9 = 1;
                                                    if (bVar2) {
                                                      Memory::WriteBarrierPtr<Js::ImplicitCallFlags>
                                                      ::WriteBarrierPtr(&local_f8,
                                                                        &this->loopImplicitCallFlags
                                                                       );
                                                      uVar4 = FunctionBody::GetLoopCount(pFStack_28)
                                                      ;
                                                      bVar2 = BufferWriter::
                                                              WriteArray<Js::ImplicitCallFlags>
                                                                        ((BufferWriter *)pFVar1,
                                                                         &local_f8,(ulong)uVar4);
                                                      local_f9 = 1;
                                                      if (bVar2) {
                                                        bVar2 = BufferWriter::
                                                                Write<Js::ImplicitCallFlags>
                                                                          ((BufferWriter *)
                                                                           functionBody,
                                                                           &this->implicitCallFlags)
                                                        ;
                                                        local_f9 = 1;
                                                        if (bVar2) {
                                                          bVar2 = BufferWriter::Write<Js::ThisInfo>
                                                                            ((BufferWriter *)
                                                                             functionBody,
                                                                             &this->thisInfo);
                                                          local_f9 = 1;
                                                          if (bVar2) {
                                                            bVar2 = BufferWriter::
                                                                                                                                        
                                                  Write<Js::DynamicProfileInfo::Bits>
                                                            ((BufferWriter *)functionBody,
                                                             &this->bits);
                                                  local_f9 = 1;
                                                  if (bVar2) {
                                                    bVar2 = BufferWriter::Write<unsigned_int>
                                                                      ((BufferWriter *)functionBody,
                                                                       &this->m_recursiveInlineInfo)
                                                    ;
                                                    local_f9 = 1;
                                                    if (bVar2) {
                                                      ppBVar6 = Memory::WriteBarrierPtr::
                                                                operator_cast_to_BVFixed__
                                                                          ((WriteBarrierPtr *)
                                                                           &this->loopFlags);
                                                      pFVar1 = functionBody;
                                                      local_1d9 = 0;
                                                      if (*ppBVar6 != (BVFixed *)0x0) {
                                                        pBVar7 = Memory::WriteBarrierPtr<BVFixed>::
                                                                 operator->(&this->loopFlags);
                                                        data = BVFixed::GetData(pBVar7);
                                                        pBVar7 = Memory::WriteBarrierPtr<BVFixed>::
                                                                 operator->(&this->loopFlags);
                                                        BVar5 = BVFixed::WordCount(pBVar7);
                                                        bVar2 = BufferWriter::
                                                                WriteArray<BVUnitT<unsigned_long>>
                                                                          ((BufferWriter *)pFVar1,
                                                                           data,(ulong)BVar5);
                                                        local_1d9 = bVar2 ^ 0xff;
                                                      }
                                                      local_f9 = local_1d9;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (local_f9 & 1) == 0;
}

Assistant:

bool DynamicProfileInfo::Serialize(T * writer)
    {
#if DBG_DUMP
        writer->Log(this);
#endif
        FunctionBody * functionBody = this->GetFunctionBody();
        Js::ArgSlot paramInfoCount = functionBody->GetProfiledInParamsCount();
        if (!writer->Write(functionBody->GetLocalFunctionId())
            || !writer->Write(paramInfoCount)
            || !writer->WriteArray(this->parameterInfo, paramInfoCount)
            || !writer->Write(functionBody->GetProfiledLdLenCount())
            || !writer->WriteArray(this->ldLenInfo, functionBody->GetProfiledLdLenCount())
            || !writer->Write(functionBody->GetProfiledLdElemCount())
            || !writer->WriteArray(this->ldElemInfo, functionBody->GetProfiledLdElemCount())
            || !writer->Write(functionBody->GetProfiledStElemCount())
            || !writer->WriteArray(this->stElemInfo, functionBody->GetProfiledStElemCount())
            || !writer->Write(functionBody->GetProfiledArrayCallSiteCount())
            || !writer->WriteArray(this->arrayCallSiteInfo, functionBody->GetProfiledArrayCallSiteCount())
            || !writer->Write(functionBody->GetProfiledFldCount())
            || !writer->WriteArray(this->fldInfo, functionBody->GetProfiledFldCount())
            || !writer->Write(functionBody->GetProfiledSlotCount())
            || !writer->WriteArray(this->slotInfo, functionBody->GetProfiledSlotCount())
            || !writer->Write(functionBody->GetProfiledCallSiteCount())
            || !writer->WriteArray(this->callSiteInfo, functionBody->GetProfiledCallSiteCount())
            || !writer->Write(functionBody->GetProfiledCallApplyCallSiteCount())
            || !writer->WriteArray(this->callApplyTargetInfo, functionBody->GetProfiledCallApplyCallSiteCount())
            || !writer->Write(functionBody->GetProfiledDivOrRemCount())
            || !writer->WriteArray(this->divideTypeInfo, functionBody->GetProfiledDivOrRemCount())
            || !writer->Write(functionBody->GetProfiledSwitchCount())
            || !writer->WriteArray(this->switchTypeInfo, functionBody->GetProfiledSwitchCount())
            || !writer->Write(functionBody->GetProfiledReturnTypeCount())
            || !writer->WriteArray(this->returnTypeInfo, functionBody->GetProfiledReturnTypeCount())
            || !writer->Write(functionBody->GetLoopCount())
            || !writer->WriteArray(this->loopImplicitCallFlags, functionBody->GetLoopCount())
            || !writer->Write(this->implicitCallFlags)
            || !writer->Write(this->thisInfo)
            || !writer->Write(this->bits)
            || !writer->Write(this->m_recursiveInlineInfo)
            || (this->loopFlags && !writer->WriteArray(this->loopFlags->GetData(), this->loopFlags->WordCount())))
        {
            return false;
        }
        return true;
    }